

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_frostbite(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  short sVar3;
  char *txt;
  short sVar4;
  AFFECT_DATA *pAVar5;
  short sVar6;
  AFFECT_DATA af;
  
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,5);
  if (bVar1) {
    txt = "You failed.\n\r";
LAB_0035cf6b:
    send_to_char(txt,ch);
    return;
  }
  iVar2 = number_range(0,1);
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  sVar3 = (short)level;
  sVar6 = (short)sn;
  af.type = sVar6;
  af.level = sVar3;
  if (iVar2 == 0) {
    if ((bVar1) && (*(short *)((long)vo + 0x304) < 2)) {
      txt = "There is no warmth remaining in their arm to be siphoned away.\n\r";
      goto LAB_0035cf6b;
    }
    act("$N\'s arm goes limp as you draw heat from it.",ch,(void *)0x0,vo,3);
    act_new("Your arm goes limp as $n draws heat from it.",ch,(void *)0x0,vo,2,4);
    act("$N\'s arm goes limp as $n draws heat from it.",ch,(void *)0x0,vo,1);
    pAVar5 = (AFFECT_DATA *)((long)vo + 0x88);
    while (pAVar5 = pAVar5->next, pAVar5 != (AFFECT_DATA *)0x0) {
      if ((pAVar5->type == sn) && (pAVar5->location == 1)) {
        affect_remove((CHAR_DATA *)vo,pAVar5);
      }
    }
    init_affect(&af);
    af.where = 0;
    af.aftype = 3;
    sVar4 = (short)(level / 6);
    af.modifier = (short)(level / -5);
    af.location = 1;
    af.duration = sVar4;
    affect_to_char((CHAR_DATA *)vo,&af);
    bVar1 = saves_spell(level + -2,(CHAR_DATA *)vo,5);
    if (bVar1) {
      return;
    }
    act("$N\'s screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!"
        ,ch,(void *)0x0,vo,3);
    act_new("Shooting pains run through your arm as $n chills it, and then suddenly, you have no feeling in it at all."
            ,ch,(void *)0x0,vo,2,4);
    act("$N\'s screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!"
        ,ch,(void *)0x0,vo,1);
    init_affect(&af);
    af.location = 0x22;
    af.modifier = -1;
  }
  else {
    if ((bVar1) && (*(short *)((long)vo + 0x306) < 2)) {
      txt = "There is no warmth remaining in their leg to be siphoned away.\n\r";
      goto LAB_0035cf6b;
    }
    act("$N\'s leg goes limp as you draw heat from it.",ch,(void *)0x0,vo,3);
    act_new("Your leg goes limp as $n draws heat from it.",ch,(void *)0x0,vo,2,4);
    act("$N\'s leg goes limp as $n draws heat from it.",ch,(void *)0x0,vo,1);
    pAVar5 = (AFFECT_DATA *)((long)vo + 0x88);
    while (pAVar5 = pAVar5->next, pAVar5 != (AFFECT_DATA *)0x0) {
      if ((pAVar5->type == sn) && (pAVar5->location == 2)) {
        affect_remove((CHAR_DATA *)vo,pAVar5);
      }
    }
    init_affect(&af);
    af.where = 0;
    af.aftype = 3;
    sVar4 = (short)(level / 6);
    af.modifier = (short)(level / -5);
    af.location = 2;
    af.duration = sVar4;
    affect_to_char((CHAR_DATA *)vo,&af);
    bVar1 = saves_spell(level + -2,(CHAR_DATA *)vo,5);
    if (bVar1) {
      return;
    }
    act("$N nearly collapses to the ground as $S leg is frozen solid!",ch,(void *)0x0,vo,3);
    act_new("Shooting pains run through your leg as $n chills it, and then suddenly, you have no feeling in it at all."
            ,ch,(void *)0x0,vo,2,4);
    act("$N nearly collapses to the ground as $S leg is frozen solid!",ch,(void *)0x0,vo,1);
    init_affect(&af);
    af.location = 0x21;
    af.modifier = -1;
  }
  af.aftype = 5;
  af.where = 0;
  af.type = sVar6;
  af.level = sVar3;
  af.duration = sVar4;
  affect_to_char((CHAR_DATA *)vo,&af);
  return;
}

Assistant:

void spell_frostbite(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af, *paf;

	if (saves_spell(level, victim, DAM_COLD))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (number_range(0, 1) == 0)
	{
		if (is_affected(victim, sn) && victim->arms < 2)
		{
			send_to_char("There is no warmth remaining in their arm to be siphoned away.\n\r", ch);
			return;
		}

		act("$N's arm goes limp as you draw heat from it.", ch, 0, victim, TO_CHAR);
		act_new("Your arm goes limp as $n draws heat from it.", ch, 0, victim, TO_VICT, POS_SLEEPING);
		act("$N's arm goes limp as $n draws heat from it.", ch, 0, victim, TO_NOTVICT);

		for (paf = victim->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->type == sn && paf->location == APPLY_STR)
				affect_remove(victim, paf);
		}

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_STR;
		af.duration = level / 6;
		af.level = level;
		af.modifier = -(level / 5);
		affect_to_char(victim, &af);

		if (!saves_spell(level - 2, victim, DAM_COLD))
		{
			act("$N's screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!", ch, 0, victim, TO_CHAR);
			act_new("Shooting pains run through your arm as $n chills it, and then suddenly, you have no feeling in it at all.", ch, 0, victim, TO_VICT, POS_SLEEPING);
			act("$N's screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!", ch, 0, victim, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.type = sn;
			af.location = APPLY_ARMS;
			af.duration = level / 6;
			af.level = level;
			af.modifier = -1;
			affect_to_char(victim, &af);
		}
	}
	else
	{
		if (is_affected(victim, sn) && victim->legs < 2)
		{
			send_to_char("There is no warmth remaining in their leg to be siphoned away.\n\r", ch);
			return;
		}

		act("$N's leg goes limp as you draw heat from it.", ch, 0, victim, TO_CHAR);
		act_new("Your leg goes limp as $n draws heat from it.", ch, 0, victim, TO_VICT, POS_SLEEPING);
		act("$N's leg goes limp as $n draws heat from it.", ch, 0, victim, TO_NOTVICT);

		for (paf = victim->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->type == sn && paf->location == APPLY_DEX)
				affect_remove(victim, paf);
		}

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_DEX;
		af.duration = level / 6;
		af.level = level;
		af.modifier = -(level / 5);
		affect_to_char(victim, &af);

		if (!saves_spell(level - 2, victim, DAM_COLD))
		{
			act("$N nearly collapses to the ground as $S leg is frozen solid!", ch, 0, victim, TO_CHAR);
			act_new("Shooting pains run through your leg as $n chills it, and then suddenly, you have no feeling in it at all.", ch, 0, victim, TO_VICT, POS_SLEEPING);
			act("$N nearly collapses to the ground as $S leg is frozen solid!", ch, 0, victim, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.type = sn;
			af.location = APPLY_LEGS;
			af.duration = level / 6;
			af.level = level;
			af.modifier = -1;
			affect_to_char(victim, &af);
		}
	}
}